

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O3

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0> *this,Target *target
               ,ROMFetcher *rom_fetcher)

{
  Observer *pOVar1;
  AsyncTaskQueue<false,_true,_void> *this_00;
  AY38910<false> *sources;
  Video<(Sinclair::ZXSpectrum::Video::Timing)0> *this_01;
  Source *pSVar2;
  byte bVar3;
  _Rb_tree_color _Var4;
  Struct *pSVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  uint uVar8;
  Joystick *pJVar9;
  ulong uVar10;
  undefined4 *puVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  size_t __n;
  uint8_t **ppuVar15;
  _Base_ptr p_Var16;
  long lVar17;
  State *state;
  ulong uVar18;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  Joystick *local_90;
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_88;
  Request local_58;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_00590d50;
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_0059f7b8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00598df8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0059f7d0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_00590d80;
  p_Var16 = &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = p_Var16;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = p_Var16;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&local_88);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree(&local_88);
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00591690;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00591610;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00591648;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  local_88._M_impl._0_4_ = 2;
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>
            (&this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>,
             (Machine *)&local_88);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_0059f420;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0059f4f0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059f508;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059f528;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059f558;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059f570;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059f588;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059f5b8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059f5f8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059f610;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059f648;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_0059f690;
  CPU::Z80::
  Processor<Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)0>,_false,_false>
  ::Processor(&this->z80_,this);
  this->port1ffd_ = '\0';
  this->port7ffd_ = '\0';
  this->disable_paging_ = false;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  sources = &this->ay_;
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&sources->super_AY38910SampleSource<false>,AY38910,this_00);
  (this->ay_).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  Audio::Toggle::Toggle(&this->audio_toggle_,this_00);
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>::CompoundSource
            (&this->mixer_,sources,&this->audio_toggle_);
  Outputs::Speaker::
  PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>::
  PullLowpass(&this->speaker_,&this->mixer_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059f8f8;
  this_01 = &(this->video_).object_;
  ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>::Video(this_01);
  (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).is_flushed_ = true;
  (this->video_).did_flush_ = false;
  (this->video_).clocking_preference_ = JustInTime;
  (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  ZX::Keyboard::Keyboard::Keyboard(&this->keyboard_,ZXSpectrum);
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,ZXSpectrum);
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,7000000);
  this->tape_player_is_sleeping_ = false;
  this->use_automatic_tape_motor_control_ = true;
  (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)
   ((long)&(this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ + 6) = 0;
  local_88._M_impl._0_4_ = 7000000;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::JustInTimeActor<unsigned_int>
            (&this->fdc_,(uint *)&local_88);
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = 0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TimedMachine).clock_rate_ = 3500000.0;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle>_>,_false>
                   ,1.75e+06);
  ROM::Request::Request(&local_58,Spectrum48k,false);
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_88,(_Any_data *)rom_fetcher,&local_58);
  bVar7 = ROM::Request::validate(&local_58,(Map *)&local_88);
  if (!bVar7) {
    puVar11 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar11 = 0;
    __cxa_throw(puVar11,&ROMMachine::Error::typeinfo,0);
  }
  pOVar1 = &this->super_Observer;
  p_Var14 = p_Var16;
  p_Var6 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var12 = p_Var6;
      p_Var13 = p_Var14;
      _Var4 = p_Var12[1]._M_color;
      p_Var14 = p_Var12;
      if ((int)_Var4 < 100) {
        p_Var14 = p_Var13;
      }
      p_Var6 = (&p_Var12->_M_left)[(int)_Var4 < 100];
    } while ((&p_Var12->_M_left)[(int)_Var4 < 100] != (_Base_ptr)0x0);
    if (p_Var14 != p_Var16) {
      if ((int)_Var4 < 100) {
        p_Var12 = p_Var13;
      }
      if ((int)p_Var12[1]._M_color < 0x65) {
        p_Var16 = p_Var14;
      }
    }
  }
  __n = (long)p_Var16[1]._M_left - (long)p_Var16[1]._M_parent;
  if (0xffff < __n) {
    __n = 0x10000;
  }
  memcpy(&this->rom_,p_Var16[1]._M_parent,__n);
  pSVar2 = &(this->tape_player_).super_TapePlayer.super_Source;
  (this->tape_player_).super_TapePlayer.super_Source.observer_ = pOVar1;
  uVar8 = (**(this->tape_player_).super_TapePlayer.super_Source._vptr_Source)(pSVar2);
  (**pOVar1->_vptr_Observer)(pOVar1,pSVar2,(ulong)uVar8);
  pJVar9 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_ee96bb::Joystick::Joystick(pJVar9);
  local_90 = pJVar9;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_90);
  pJVar9 = (Joystick *)operator_new(0x48);
  anon_unknown.dwarf_ee96bb::Joystick::Joystick(pJVar9);
  local_90 = pJVar9;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<(anonymous_namespace)::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_90);
  update_memory_map(this);
  set_video_address(this);
  Memory::Fuzz((this->ram_)._M_elems,0x20000);
  (*(this->super_Source)._vptr_Source[0x10])(this,&(target->super_Target).media);
  if (target->should_hold_enter == true) {
    (this->duration_to_press_enter_).super_WrappedInt<Cycles>.length_ = 17500000;
    ZX::Keyboard::Keyboard::set_key_state(&this->keyboard_,0x601,true);
  }
  pSVar5 = (target->super_Target).state._M_t.
           super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>._M_t.
           super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>.
           super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl;
  if (pSVar5 != (Struct *)0x0) {
    CPU::Z80::State::apply((State *)(pSVar5 + 1),&(this->z80_).super_ProcessorBase);
    bVar3 = *(byte *)&pSVar5[0x10]._vptr_Struct;
    (this->video_).object_.border_byte_ = bVar3;
    (this->video_).object_.border_colour_ = ""[bVar3];
    (this->video_).object_.flash_mask_ = -*(char *)&pSVar5[0x11]._vptr_Struct;
    (this->video_).object_.flash_counter_ = *(int *)((long)&pSVar5[0x11]._vptr_Struct + 4);
    (this->video_).object_.is_alternate_line_ = *(bool *)&pSVar5[0x12]._vptr_Struct;
    ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)0>::set_time_since_interrupt
              (this_01,(HalfCycles)(long)*(int *)((long)&pSVar5[0x10]._vptr_Struct + 4));
    GI::AY38910::State::apply<GI::AY38910::AY38910<false>>((State *)(pSVar5 + 0x17),sources);
    uVar10 = (long)pSVar5[0x14]._vptr_Struct - (long)pSVar5[0x13]._vptr_Struct;
    if (0x3fff < uVar10) {
      uVar18 = 0xc000;
      if (uVar10 < 0xc000) {
        uVar18 = uVar10;
      }
      uVar10 = uVar18 >> 0xe & 0x3ffff;
      ppuVar15 = &(this->banks_)._M_elems[1].write;
      lVar17 = 0;
      do {
        memcpy(*ppuVar15 + lVar17 + 0x4000,(void *)(lVar17 + (long)pSVar5[0x13]._vptr_Struct),0x4000
              );
        ppuVar15 = ppuVar15 + 3;
        uVar10 = uVar10 - 1;
        lVar17 = lVar17 + 0x4000;
      } while (uVar10 != 0);
    }
  }
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_88);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_58.node.children);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::ZXSpectrum::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			z80_(*this),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			audio_toggle_(audio_queue_),
			mixer_(ay_, audio_toggle_),
			speaker_(mixer_),
			keyboard_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			keyboard_mapper_(Sinclair::ZX::Keyboard::Machine::ZXSpectrum),
			tape_player_(clock_rate() * 2),
			fdc_(clock_rate() * 2)
		{
			set_clock_rate(clock_rate());
			speaker_.set_input_rate(float(clock_rate()) / 2.0f);

			ROM::Name rom_name;
			switch(model) {
				case Model::SixteenK:
				case Model::FortyEightK:	rom_name = ROM::Name::Spectrum48k;		break;
				case Model::OneTwoEightK:	rom_name = ROM::Name::Spectrum128k;		break;
				case Model::Plus2:			rom_name = ROM::Name::SpecrumPlus2;		break;
				case Model::Plus2a:
				case Model::Plus3:			rom_name = ROM::Name::SpectrumPlus3;	break;
				// TODO: possibly accept the +3 ROM in multiple parts?
			}
			const auto request = ROM::Request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			const auto &rom = roms.find(rom_name)->second;
			memcpy(rom_.data(), rom.data(), std::min(rom_.size(), rom.size()));

			// Register for sleeping notifications.
			tape_player_.set_clocking_hint_observer(this);

			// Attach a couple of joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Set up initial memory map.
			update_memory_map();
			set_video_address();
			Memory::Fuzz(ram_);

			// Insert media.
			insert_media(target.media);

			// Possibly depress the enter key.
			if(target.should_hold_enter) {
				// Hold it for five seconds, more or less.
				duration_to_press_enter_ = Cycles(5 * clock_rate());
				keyboard_.set_key_state(ZX::Keyboard::KeyEnter, true);
			}

			// Install state if supplied.
			if(target.state) {
				const auto state = static_cast<State *>(target.state.get());
				state->z80.apply(z80_);
				state->video.apply(*video_.last_valid());
				state->ay.apply(ay_);

				// If this is a 48k or 16k machine, remap source data from its original
				// linear form to whatever the banks end up being; otherwise copy as is.
				if(model <= Model::FortyEightK) {
					const size_t num_banks = std::min(size_t(48*1024), state->ram.size()) >> 14;
					for(size_t c = 0; c < num_banks; c++) {
						memcpy(&banks_[c + 1].write[(c+1) * 0x4000], &state->ram[c * 0x4000], 0x4000);
					}
				} else {
					memcpy(ram_.data(), state->ram.data(), std::min(ram_.size(), state->ram.size()));

					port1ffd_ = state->last_1ffd;
					port7ffd_ = state->last_7ffd;
					update_memory_map();
				}
			}
		}